

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execChkCmp2<(moira::Core)2,(moira::Instr)145,(moira::Mode)10,4>
          (Moira *this,u16 opcode)

{
  ushort uVar1;
  u32 uVar2;
  u32 uVar3;
  bool bVar4;
  i32 bound1;
  bool bVar5;
  u32 uVar6;
  int iVar7;
  
  this->cp = 0;
  uVar1 = (this->queue).irc;
  uVar6 = (this->reg).pc + 2;
  (this->reg).pc = uVar6;
  uVar6 = read<(moira::Core)2,(moira::AddrSpace)2,2,0ull>(this,uVar6);
  (this->queue).irc = (u16)uVar6;
  uVar6 = computeEA<(moira::Core)2,(moira::Mode)10,4,0ull>(this,opcode & 7);
  uVar2 = read<(moira::Core)2,(moira::AddrSpace)2,4,0ull>(this,uVar6);
  uVar3 = read<(moira::Core)2,(moira::AddrSpace)2,4,0ull>(this,uVar6 + 4);
  uVar6 = *(u32 *)((long)&(this->reg).field_3 + (ulong)(uVar1 >> 0xc) * 4);
  if ((int)uVar2 < (int)uVar3) {
    bVar5 = (int)uVar6 < (int)uVar2;
    bVar4 = (int)uVar3 < (int)uVar6;
  }
  else {
    bVar5 = (int)uVar3 < (int)uVar6;
    bVar4 = (int)uVar6 < (int)uVar2;
  }
  (this->reg).sr.c = (bool)(bVar4 | bVar5);
  (this->reg).sr.z = uVar6 == uVar3 || uVar6 == uVar2;
  if (((uVar1 >> 0xb & 1) == 0) || ((this->reg).sr.c != true)) {
    uVar6 = (this->reg).pc;
    (this->reg).pc0 = uVar6;
    (this->queue).ird = (this->queue).irc;
    uVar6 = read<(moira::Core)2,(moira::AddrSpace)2,2,4ull>(this,uVar6 + 2);
    (this->queue).irc = (u16)uVar6;
    this->readBuffer = (u16)uVar6;
    iVar7 = 0x17;
  }
  else {
    execException<(moira::Core)2>(this,CHK,0);
    iVar7 = 0x28;
  }
  (*this->_vptr_Moira[2])(this,(ulong)(uint)(iVar7 + this->cp));
  return;
}

Assistant:

void
Moira::execChkCmp2(u16 opcode)
{
    AVAILABILITY(Core::C68020)

    u32 ext = queue.irc;
    int src = _____________xxx(opcode);
    int dst = xxxx____________(ext);
    u32 ea, data1, data2;

    readExt<C>();

    readOp<C, M, S>(src, &ea, &data1);
    data2 = readM<C, M, S>(ea + S);

    if (MOIRA_MIMIC_MUSASHI) {

        auto bound1 = ((M == Mode(9) || M == Mode(10)) && S == Byte) ? (i32)data1 : SEXT<S>(data1);
        auto bound2 = ((M == Mode(9) || M == Mode(10)) && S == Byte) ? (i32)data2 : SEXT<S>(data2);
        i32 compare = readR<S>(dst);
        if (dst < 8) compare = SEXT<S>(compare);

        if (bound1 < bound2) {
            reg.sr.c = compare < bound1 || compare > bound2;
        } else {
            reg.sr.c = compare > bound2 || compare < bound1;
        }
        reg.sr.z = compare == bound1 || compare == bound2;

    } else {

        i32 bound1 = SEXT<S>(data1);
        i32 bound2 = SEXT<S>(data2);
        i32 compare = dst < 8 ? SEXT<S>(readR(dst)) : readR(dst);

        if (bound1 <= bound2) {
            reg.sr.c = compare < bound1 || compare > bound2;
        } else {
            reg.sr.c = compare < bound1 && compare > bound2;
        }
        reg.sr.z = compare == bound1 || compare == bound2;
        setUndefinedCHK2<C, S>(bound1, bound2, compare);
    }

    if ((ext & 0x800) && reg.sr.c) {

        execException<C>(M68kException::CHK);
        CYCLES_68020(40)

    } else {

        prefetch<C, POLL>();

        //           00  10  20        00  10  20        00  10  20
        //           .b  .b  .b        .w  .w  .w        .l  .l  .l
        CYCLES_AI   ( 0,  0, 22,        0,  0, 22,        0,  0, 22)
        CYCLES_DI   ( 0,  0, 23,        0,  0, 23,        0,  0, 23)
        CYCLES_IX   ( 0,  0, 25,        0,  0, 25,        0,  0, 25)
        CYCLES_AW   ( 0,  0, 22,        0,  0, 22,        0,  0, 22)
        CYCLES_AL   ( 0,  0, 22,        0,  0, 22,        0,  0, 22)
        CYCLES_DIPC ( 0,  0, 23,        0,  0, 23,        0,  0, 23)
        CYCLES_IXPC ( 0,  0, 23,        0,  0, 23,        0,  0, 23)
    }

    FINALIZE
}